

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

amqp_rpc_reply_t *
simple_rpc_inner(amqp_connection_state_t state,amqp_channel_t channel,
                amqp_method_number_t request_id,amqp_method_number_t *expected_reply_ids,
                void *decoded_request_method,amqp_time_t deadline)

{
  amqp_status_enum aVar1;
  int iVar2;
  amqp_pool_t *paVar3;
  amqp_pool_table_entry_t *__dest;
  undefined4 uVar4;
  short in_DX;
  long in_RSI;
  amqp_rpc_reply_t *in_RDI;
  amqp_method_number_t *in_R8;
  amqp_link_t *link;
  amqp_frame_t *frame_copy;
  amqp_pool_t *channel_pool;
  amqp_frame_t frame;
  amqp_rpc_reply_t result;
  int status;
  amqp_rpc_reply_t *self;
  amqp_connection_state_t in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff81;
  short in_stack_ffffffffffffff82;
  undefined4 in_stack_ffffffffffffff84;
  amqp_method_number_t in_stack_ffffffffffffff88;
  undefined2 uStack_74;
  amqp_channel_t in_stack_ffffffffffffff8e;
  amqp_connection_state_t in_stack_ffffffffffffff90;
  amqp_frame_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  amqp_time_t in_stack_ffffffffffffffb8;
  undefined8 local_38;
  
  self = in_RDI;
  memset(&stack0xffffffffffffffb0,0,0x20);
  aVar1 = amqp_send_method(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,
                           in_stack_ffffffffffffff88,
                           (void *)CONCAT44(in_stack_ffffffffffffff84,
                                            CONCAT22(in_stack_ffffffffffffff82,
                                                     CONCAT11(in_stack_ffffffffffffff81,
                                                              in_stack_ffffffffffffff80))));
  if (aVar1 < AMQP_STATUS_OK) {
    amqp_rpc_reply_error(in_RDI,aVar1);
  }
  else {
    while (aVar1 = wait_frame_inner((amqp_connection_state_t)
                                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                    in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8),
          aVar1 == AMQP_STATUS_OK) {
      if ((in_stack_ffffffffffffff80 == '\x01') &&
         (((in_stack_ffffffffffffff82 == in_DX &&
           ((iVar2 = amqp_id_in_reply_list(in_stack_ffffffffffffff88,in_R8), iVar2 != 0 ||
            (in_stack_ffffffffffffff88 == 0x140028)))) ||
          ((in_stack_ffffffffffffff82 == 0 && (in_stack_ffffffffffffff88 == 0xa0032)))))) {
        iVar2 = amqp_id_in_reply_list(in_stack_ffffffffffffff88,in_R8);
        uVar4 = 3;
        if (iVar2 != 0) {
          uVar4 = 1;
        }
        *(ulong *)in_RDI = CONCAT44(in_stack_ffffffffffffffb4,uVar4);
        *(ulong *)&in_RDI->reply =
             CONCAT26(in_stack_ffffffffffffff8e,CONCAT24(uStack_74,in_stack_ffffffffffffff88));
        (in_RDI->reply).decoded = in_stack_ffffffffffffff90;
        *(undefined8 *)&in_RDI->library_error = local_38;
        return self;
      }
      paVar3 = amqp_get_or_create_channel_pool
                         (in_stack_ffffffffffffff68,(amqp_channel_t)((ulong)self >> 0x30));
      if (paVar3 == (amqp_pool_t *)0x0) {
        amqp_rpc_reply_error(in_RDI,AMQP_STATUS_NO_MEMORY);
        return self;
      }
      __dest = (amqp_pool_table_entry_t *)
               amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffff68,(size_t)self);
      in_stack_ffffffffffffff68 =
           (amqp_connection_state_t)
           amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffff68,(size_t)self);
      if ((__dest == (amqp_pool_table_entry_t *)0x0) ||
         (in_stack_ffffffffffffff68 == (amqp_connection_state_t)0x0)) {
        amqp_rpc_reply_error(in_RDI,AMQP_STATUS_NO_MEMORY);
        return self;
      }
      memcpy(__dest,&stack0xffffffffffffff80,0x30);
      in_stack_ffffffffffffff68->pool_table[0] = (amqp_pool_table_entry_t *)0x0;
      in_stack_ffffffffffffff68->pool_table[1] = __dest;
      if (*(long *)(in_RSI + 0x108) == 0) {
        *(amqp_connection_state_t *)(in_RSI + 0x100) = in_stack_ffffffffffffff68;
      }
      else {
        **(undefined8 **)(in_RSI + 0x108) = in_stack_ffffffffffffff68;
      }
      *(amqp_connection_state_t *)(in_RSI + 0x108) = in_stack_ffffffffffffff68;
    }
    if (aVar1 == AMQP_STATUS_TIMEOUT) {
      amqp_socket_close((amqp_socket_t *)self,(amqp_socket_close_enum)((ulong)in_RDI >> 0x20));
    }
    amqp_rpc_reply_error(in_RDI,aVar1);
  }
  return self;
}

Assistant:

static amqp_rpc_reply_t simple_rpc_inner(
    amqp_connection_state_t state, amqp_channel_t channel,
    amqp_method_number_t request_id, amqp_method_number_t *expected_reply_ids,
    void *decoded_request_method, amqp_time_t deadline) {
  int status;
  amqp_rpc_reply_t result;

  memset(&result, 0, sizeof(result));

  status = amqp_send_method(state, channel, request_id, decoded_request_method);
  if (status < 0) {
    return amqp_rpc_reply_error(status);
  }

  {
    amqp_frame_t frame;

  retry:
    status = wait_frame_inner(state, &frame, deadline);
    if (status != AMQP_STATUS_OK) {
      if (status == AMQP_STATUS_TIMEOUT) {
        amqp_socket_close(state->socket, AMQP_SC_FORCE);
      }
      return amqp_rpc_reply_error(status);
    }

    /*
     * We store the frame for later processing unless it's something
     * that directly affects us here, namely a method frame that is
     * either
     *  - on the channel we want, and of the expected type, or
     *  - on the channel we want, and a channel.close frame, or
     *  - on channel zero, and a connection.close frame.
     */
    if (!((frame.frame_type == AMQP_FRAME_METHOD) &&
          (((frame.channel == channel) &&
            (amqp_id_in_reply_list(frame.payload.method.id,
                                   expected_reply_ids) ||
             (frame.payload.method.id == AMQP_CHANNEL_CLOSE_METHOD))) ||
           ((frame.channel == 0) &&
            (frame.payload.method.id == AMQP_CONNECTION_CLOSE_METHOD))))) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;

      goto retry;
    }

    result.reply_type =
        (amqp_id_in_reply_list(frame.payload.method.id, expected_reply_ids))
            ? AMQP_RESPONSE_NORMAL
            : AMQP_RESPONSE_SERVER_EXCEPTION;

    result.reply = frame.payload.method;
    return result;
  }
}